

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void CanonicalizePath(char *path,size_t *len,uint64_t *slash_bits)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  char *components [60];
  
  if (*len == 0) {
    return;
  }
  pcVar5 = path + *len;
  pcVar2 = path + (*path == '/');
  uVar7 = 0;
  pcVar8 = pcVar2;
LAB_001209cd:
  while( true ) {
    if (pcVar5 <= pcVar8) {
      if (pcVar2 == path) {
        pcVar2[0] = '.';
        pcVar2[1] = '\0';
        pcVar2 = pcVar2 + 2;
      }
      *len = (size_t)(pcVar2 + ~(ulong)path);
      *slash_bits = 0;
      return;
    }
    lVar9 = 1;
    if (*pcVar8 != '/') break;
LAB_001209fe:
    pcVar8 = pcVar8 + lVar9;
  }
  iVar6 = (int)uVar7;
  if (*pcVar8 == '.') {
    pcVar3 = pcVar8 + 1;
    lVar9 = 2;
    if ((pcVar3 == pcVar5) || (*pcVar3 == '/')) goto LAB_001209fe;
    if ((*pcVar3 == '.') && ((pcVar1 = pcVar8 + 2, pcVar1 == pcVar5 || (*pcVar1 == '/')))) {
      if (iVar6 < 1) {
        *pcVar2 = '.';
        pcVar2[1] = *pcVar3;
        pcVar2[2] = *pcVar1;
        pcVar2 = pcVar2 + 3;
      }
      else {
        uVar7 = (ulong)(iVar6 - 1);
        pcVar2 = components[uVar7];
      }
      pcVar8 = pcVar8 + 3;
      goto LAB_001209cd;
    }
  }
  if (iVar6 == 0x3c) {
    Fatal("path has too many components : %s",path);
  }
  components[iVar6] = pcVar2;
  uVar7 = (ulong)(iVar6 + 1);
  pcVar3 = pcVar2;
  for (; pcVar2 = pcVar3 + 1, pcVar8 != pcVar5; pcVar8 = pcVar8 + 1) {
    if (*pcVar8 == '/') {
      cVar4 = '/';
      goto LAB_00120a56;
    }
    *pcVar3 = *pcVar8;
    pcVar3 = pcVar2;
  }
  cVar4 = *pcVar5;
  pcVar8 = pcVar5;
LAB_00120a56:
  pcVar8 = pcVar8 + 1;
  *pcVar3 = cVar4;
  goto LAB_001209cd;
}

Assistant:

void CanonicalizePath(char* path, size_t* len, uint64_t* slash_bits) {
  // WARNING: this function is performance-critical; please benchmark
  // any changes you make to it.
  if (*len == 0) {
    return;
  }

  const int kMaxPathComponents = 60;
  char* components[kMaxPathComponents];
  int component_count = 0;

  char* start = path;
  char* dst = start;
  const char* src = start;
  const char* end = start + *len;

  if (IsPathSeparator(*src)) {
#ifdef _WIN32

    // network path starts with //
    if (*len > 1 && IsPathSeparator(*(src + 1))) {
      src += 2;
      dst += 2;
    } else {
      ++src;
      ++dst;
    }
#else
    ++src;
    ++dst;
#endif
  }

  while (src < end) {
    if (*src == '.') {
      if (src + 1 == end || IsPathSeparator(src[1])) {
        // '.' component; eliminate.
        src += 2;
        continue;
      } else if (src[1] == '.' && (src + 2 == end || IsPathSeparator(src[2]))) {
        // '..' component.  Back up if possible.
        if (component_count > 0) {
          dst = components[component_count - 1];
          src += 3;
          --component_count;
        } else {
          *dst++ = *src++;
          *dst++ = *src++;
          *dst++ = *src++;
        }
        continue;
      }
    }

    if (IsPathSeparator(*src)) {
      src++;
      continue;
    }

    if (component_count == kMaxPathComponents)
      Fatal("path has too many components : %s", path);
    components[component_count] = dst;
    ++component_count;

    while (src != end && !IsPathSeparator(*src))
      *dst++ = *src++;
    *dst++ = *src++;  // Copy '/' or final \0 character as well.
  }

  if (dst == start) {
    *dst++ = '.';
    *dst++ = '\0';
  }

  *len = dst - start - 1;
#ifdef _WIN32
  uint64_t bits = 0;
  uint64_t bits_mask = 1;

  for (char* c = start; c < start + *len; ++c) {
    switch (*c) {
      case '\\':
        bits |= bits_mask;
        *c = '/';
        NINJA_FALLTHROUGH;
      case '/':
        bits_mask <<= 1;
    }
  }

  *slash_bits = bits;
#else
  *slash_bits = 0;
#endif
}